

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>::load
          (type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  npy_api *pnVar3;
  undefined7 in_register_00000011;
  handle *this_00;
  array ref;
  array buf;
  EigenConformable<true> fits;
  handle local_68;
  handle local_60;
  object local_58;
  EigenConformable<true> local_50;
  
  this_00 = &local_68;
  if (((int)CONCAT71(in_register_00000011,convert) == 0) &&
     (bVar1 = array_t<double,_16>::check_(src), !bVar1)) {
    return false;
  }
  bVar1 = false;
  array::ensure((array *)&local_60,src,0);
  if (local_60.m_ptr == (PyObject *)0x0) goto LAB_0024ad29;
  iVar2 = *(int *)&local_60.m_ptr[1].ob_type;
  if (((long)iVar2 - 3U < 0xfffffffffffffffe) ||
     (EigenProps<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::conformable(&local_50,(array *)&local_60),
     local_50.conformable == false)) {
    bVar1 = false;
    goto LAB_0024ad29;
  }
  if ((local_50.rows != 1) || (local_50.cols != 5)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x11d,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 1, 5>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 1, 5>]"
                 );
  }
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_68 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>>
                       (&this->value,(PyObject *)&_Py_NoneStruct,true);
  object::~object(&local_58);
  if (iVar2 == 1) {
    pnVar3 = npy_api::get();
    local_58.super_handle.m_ptr = (handle)(*pnVar3->PyArray_Squeeze_)(local_68.m_ptr);
LAB_0024acf3:
    object::operator=((object *)this_00,&local_58);
    object::~object(&local_58);
  }
  else if (*(int *)&local_68.m_ptr[1].ob_type == 1) {
    pnVar3 = npy_api::get();
    local_58.super_handle.m_ptr = (handle)(*pnVar3->PyArray_Squeeze_)(local_60.m_ptr);
    this_00 = &local_60;
    goto LAB_0024acf3;
  }
  pnVar3 = npy_api::get();
  iVar2 = (*pnVar3->PyArray_CopyInto_)(local_68.m_ptr,local_60.m_ptr);
  bVar1 = -1 < iVar2;
  if (!bVar1) {
    PyErr_Clear();
  }
  object::~object((object *)&local_68);
LAB_0024ad29:
  object::~object((object *)&local_60);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        // If we're in no-convert mode, only load if given an array of the correct type
        if (!convert && !isinstance<array_t<Scalar>>(src))
            return false;

        // Coerce into an array, but don't do type conversion yet; the copy below handles it.
        auto buf = array::ensure(src);

        if (!buf)
            return false;

        auto dims = buf.ndim();
        if (dims < 1 || dims > 2)
            return false;

        auto fits = props::conformable(buf);
        if (!fits)
            return false;

        // Allocate the new type, then build a numpy reference into it
        value = Type(fits.rows, fits.cols);
        auto ref = reinterpret_steal<array>(eigen_ref_array<props>(value));
        if (dims == 1) ref = ref.squeeze();
        else if (ref.ndim() == 1) buf = buf.squeeze();

        int result = detail::npy_api::get().PyArray_CopyInto_(ref.ptr(), buf.ptr());

        if (result < 0) { // Copy failed!
            PyErr_Clear();
            return false;
        }

        return true;
    }